

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

JavascriptNativeFloatArray *
Js::JavascriptArray::BoxStackInstance<Js::JavascriptNativeFloatArray>
          (JavascriptNativeFloatArray *instance,bool deepCopy)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DynamicTypeHandler *this;
  type_info *ptVar4;
  JavascriptNativeFloatArray *pJVar5;
  Recycler *pRVar6;
  Type *pTVar7;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  bVar2 = ThreadContext::IsOnStack(instance);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2f6d,"(ThreadContext::IsOnStack(instance))",
                                "ThreadContext::IsOnStack(instance)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (deepCopy) {
    pTVar7 = (Type *)0x0;
  }
  else {
    pJVar5 = (JavascriptNativeFloatArray *)
             instance[-1].super_JavascriptNativeArray.weakRefToFuncBody.ptr;
    if (pJVar5 != (JavascriptNativeFloatArray *)0x0) {
      return pJVar5;
    }
    pTVar7 = &instance[-1].super_JavascriptNativeArray.weakRefToFuncBody;
  }
  this = DynamicObject::GetTypeHandler((DynamicObject *)instance);
  ptVar4 = (type_info *)DynamicTypeHandler::GetInlineSlotsSize(this);
  bVar2 = ThreadContext::IsOnStack
                    ((instance->super_JavascriptNativeArray).super_JavascriptArray.head.ptr);
  if (bVar2 || deepCopy) {
    if (deepCopy) {
      pJVar5 = DeepCopyInstance<Js::JavascriptNativeFloatArray>(instance);
      goto LAB_00a68a55;
    }
    pRVar6 = RecyclableObject::GetRecycler((RecyclableObject *)instance);
    data.typeinfo =
         ptVar4 + (ulong)((instance->super_JavascriptNativeArray).super_JavascriptArray.head.ptr)->
                         size * 8 + 0x18;
    local_50 = (undefined1  [8])&JavascriptNativeFloatArray::typeinfo;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_693dcf2;
    data.filename._0_4_ = 0x2f90;
    pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,(TrackAllocData *)local_50);
    pJVar5 = (JavascriptNativeFloatArray *)new<Memory::Recycler>(0x40,pRVar6,0x398e98,0);
    bVar2 = true;
  }
  else {
    pRVar6 = RecyclableObject::GetRecycler((RecyclableObject *)instance);
    if (ptVar4 == (type_info *)0x0) {
      local_50 = (undefined1  [8])&JavascriptNativeFloatArray::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_693dcf2;
      data.filename._0_4_ = 0x2f99;
      pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,(TrackAllocData *)local_50);
      pJVar5 = (JavascriptNativeFloatArray *)new<Memory::Recycler>(0x40,pRVar6,0x37a1d4);
    }
    else {
      local_50 = (undefined1  [8])&JavascriptNativeFloatArray::typeinfo;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_693dcf2;
      data.filename._0_4_ = 0x2f95;
      data.typeinfo = ptVar4;
      pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,(TrackAllocData *)local_50);
      pJVar5 = (JavascriptNativeFloatArray *)new<Memory::Recycler>(0x40,pRVar6,0x398e98,0);
    }
    bVar2 = false;
  }
  JavascriptNativeFloatArray::JavascriptNativeFloatArray(pJVar5,instance,bVar2,false);
LAB_00a68a55:
  if (pTVar7 != (Type *)0x0) {
    pTVar7->ptr = (RecyclerWeakReference<Js::FunctionBody> *)pJVar5;
  }
  return pJVar5;
}

Assistant:

T * JavascriptArray::BoxStackInstance(T * instance, bool deepCopy)
    {
        Assert(ThreadContext::IsOnStack(instance));
        T * boxedInstance;
        T ** boxedInstanceRef;
        if (!deepCopy)
        {
            // On the stack, the we reserved a pointer before the object as to store the boxed value
            boxedInstanceRef = ((T **)instance) - 1;
            boxedInstance = *boxedInstanceRef;
            if (boxedInstance)
            {
                return boxedInstance;
            }
        }
        else
        {
            // When doing a deep copy, do not cache the boxed value to ensure that only shallow copies
            // are reused
            boxedInstance = nullptr;
            boxedInstanceRef = nullptr;
        }

        const size_t inlineSlotsSize = instance->GetTypeHandler()->GetInlineSlotsSize();
        if (ThreadContext::IsOnStack(instance->head) || deepCopy)
        {
            // Reallocate both the object as well as the head segment when the head is on the stack or
            // when a deep copy is needed. This is to prevent a scenario where box may leave either one
            // on the stack when both must be on the heap.
            if (deepCopy)
            {
                boxedInstance = DeepCopyInstance(instance);
            }
            else
            {
                boxedInstance = RecyclerNewPlusZ(instance->GetRecycler(),
                    inlineSlotsSize + sizeof(Js::SparseArraySegmentBase) + instance->head->size * sizeof(typename T::TElement),
                    T, instance, true /*boxHead*/, false /*deepCopy*/);
            }
        }
        else if(inlineSlotsSize)
        {
            boxedInstance = RecyclerNewPlusZ(instance->GetRecycler(), inlineSlotsSize, T, instance, false, false);
        }
        else
        {
            boxedInstance = RecyclerNew(instance->GetRecycler(), T, instance, false, false);
        }

        if (boxedInstanceRef != nullptr)
        {
            *boxedInstanceRef = boxedInstance;
        }
        return boxedInstance;
    }